

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

void __thiscall
SplitNTest_random_Test<char32_t>::SplitNTest_random_Test(SplitNTest_random_Test<char32_t> *this)

{
  SplitNTest_random_Test<char32_t> *this_local;
  
  SplitNTest<char32_t>::SplitNTest(&this->super_SplitNTest<char32_t>);
  *(undefined ***)&this->super_SplitNTest<char32_t> = &PTR__SplitNTest_random_Test_0081c260;
  return;
}

Assistant:

TYPED_TEST(SplitNTest, random) {
	RandomTestData<TypeParam> data{};
	constexpr size_t n = 4;
	std::vector<std::basic_string<TypeParam>> split_result = split_n(data.m_str, default_delim<TypeParam>, n);

	// Tokens shall be same up until last one (n + 1)
	EXPECT_EQ(split_result.size(), n + 1);
	for (size_t index = 0; index != n; ++index) {
		EXPECT_EQ(split_result[index], data.m_tokens[index]);
	}

	EXPECT_EQ(split_result[n], data.get_remainder(n));
}